

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _List_node_base **pp_Var1;
  const_iterator cVar2;
  double dVar3;
  double dVar4;
  ActionTest actionTest;
  variables_map args;
  DynamicGraphTest graphTest;
  PathCompleteGraphsBenchmark local_288;
  code *local_190 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_180 [8];
  _Rb_tree_node_base local_178;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  DynamicGraphTest local_f0;
  
  parseArguments((int)local_190,(char **)(ulong)(uint)argc);
  pp_Var1 = (_List_node_base **)
            ((long)&local_288.super_Benchmark.G.super_UndirectedGraph.super_type.m_edges + 8);
  local_288.super_Benchmark._vptr_Benchmark = (_func_int **)pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"test","");
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_180,(key_type *)&local_288);
  if ((_List_node_base **)local_288.super_Benchmark._vptr_Benchmark != pp_Var1) {
    operator_delete(local_288.super_Benchmark._vptr_Benchmark,
                    (ulong)((long)&(local_288.super_Benchmark.G.super_UndirectedGraph.super_type.
                                    m_edges.
                                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                                    ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1));
  }
  if (cVar2._M_node != &local_178) {
    ActionTest::ActionTest((ActionTest *)&local_288);
    DynamicGraphTest::DynamicGraphTest(&local_f0);
    ActionTest::run((ActionTest *)&local_288);
    DynamicGraphTest::run(&local_f0);
    local_f0.super_Test._vptr_Test = (_func_int **)&PTR_run_00120bd8;
    DynamicGraph::~DynamicGraph(&local_f0.G);
    local_288.super_Benchmark._vptr_Benchmark = (_func_int **)&PTR_run_00120c18;
    std::vector<Relatives,_std::allocator<Relatives>_>::~vector
              ((vector<Relatives,_std::allocator<Relatives>_> *)&local_288.deletionSet);
    DynamicGraph::~DynamicGraph(&local_288.super_Benchmark.G);
  }
  local_288.super_Benchmark._vptr_Benchmark = (_func_int **)pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"benchmark","");
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_180,(key_type *)&local_288);
  if ((_List_node_base **)local_288.super_Benchmark._vptr_Benchmark != pp_Var1) {
    operator_delete(local_288.super_Benchmark._vptr_Benchmark,
                    (ulong)((long)&(local_288.super_Benchmark.G.super_UndirectedGraph.super_type.
                                    m_edges.
                                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                                    ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1));
  }
  if (cVar2._M_node != &local_178) {
    local_288.super_Benchmark._vptr_Benchmark = (_func_int **)pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"path","");
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_180,(key_type *)&local_288);
    if ((_List_node_base **)local_288.super_Benchmark._vptr_Benchmark != pp_Var1) {
      operator_delete(local_288.super_Benchmark._vptr_Benchmark,
                      (ulong)((long)&(local_288.super_Benchmark.G.super_UndirectedGraph.super_type.
                                      m_edges.
                                      super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                                      ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1))
      ;
    }
    if (cVar2._M_node != &local_178) {
      PathBenchmark::PathBenchmark((PathBenchmark *)&local_288,vertices);
      PathBenchmark::run((PathBenchmark *)&local_288,deletions,queries);
      local_288.super_Benchmark._vptr_Benchmark = (_func_int **)&PTR_getDeletionsTime_00120c48;
      DynamicGraph::~DynamicGraph(&local_288.super_Benchmark.G);
    }
    local_288.super_Benchmark._vptr_Benchmark = (_func_int **)pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"tree","");
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_180,(key_type *)&local_288);
    if ((_List_node_base **)local_288.super_Benchmark._vptr_Benchmark != pp_Var1) {
      operator_delete(local_288.super_Benchmark._vptr_Benchmark,
                      (ulong)((long)&(local_288.super_Benchmark.G.super_UndirectedGraph.super_type.
                                      m_edges.
                                      super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                                      ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1))
      ;
    }
    if (cVar2._M_node != &local_178) {
      TreeBenchmark::TreeBenchmark((TreeBenchmark *)&local_288,vertices);
      TreeBenchmark::run((TreeBenchmark *)&local_288,deletions,queries);
      local_288.super_Benchmark._vptr_Benchmark = (_func_int **)&PTR_getDeletionsTime_00120c48;
      DynamicGraph::~DynamicGraph(&local_288.super_Benchmark.G);
    }
    local_288.super_Benchmark._vptr_Benchmark = (_func_int **)pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"random","");
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_180,(key_type *)&local_288);
    if ((_List_node_base **)local_288.super_Benchmark._vptr_Benchmark != pp_Var1) {
      operator_delete(local_288.super_Benchmark._vptr_Benchmark,
                      (ulong)((long)&(local_288.super_Benchmark.G.super_UndirectedGraph.super_type.
                                      m_edges.
                                      super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                                      ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1))
      ;
    }
    if (cVar2._M_node != &local_178) {
      RandomGraphBenchmark::RandomGraphBenchmark((RandomGraphBenchmark *)&local_288,vertices,edges);
      RandomGraphBenchmark::run((RandomGraphBenchmark *)&local_288,deletions,queries);
      local_288.super_Benchmark._vptr_Benchmark = (_func_int **)&PTR_getDeletionsTime_00120c48;
      DynamicGraph::~DynamicGraph(&local_288.super_Benchmark.G);
    }
    local_288.super_Benchmark._vptr_Benchmark = (_func_int **)pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"path-complete","");
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_180,(key_type *)&local_288);
    if ((_List_node_base **)local_288.super_Benchmark._vptr_Benchmark != pp_Var1) {
      operator_delete(local_288.super_Benchmark._vptr_Benchmark,
                      (ulong)((long)&(local_288.super_Benchmark.G.super_UndirectedGraph.super_type.
                                      m_edges.
                                      super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                                      ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1))
      ;
    }
    if (cVar2._M_node != &local_178) {
      dVar3 = ((double)CONCAT44(0x45300000,(int)(vertices >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)vertices) - 4503599627370496.0);
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      dVar4 = ((double)CONCAT44(0x45300000,(int)(vertices >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)vertices) - 4503599627370496.0);
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      PathCompleteGraphsBenchmark::PathCompleteGraphsBenchmark(&local_288,(int)dVar3,(int)dVar4);
      PathCompleteGraphsBenchmark::run(&local_288,deletions,queries);
      local_288.super_Benchmark._vptr_Benchmark = (_func_int **)&PTR_getDeletionsTime_00120d20;
      std::
      _Rb_tree<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::_Identity<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
      ::~_Rb_tree(&local_288.deletionSet._M_t);
      local_288.super_Benchmark._vptr_Benchmark = (_func_int **)&PTR_getDeletionsTime_00120c48;
      DynamicGraph::~DynamicGraph(&local_288.super_Benchmark.G);
    }
  }
  local_288.super_Benchmark._vptr_Benchmark = (_func_int **)pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"example","");
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_180,(key_type *)&local_288);
  if ((_List_node_base **)local_288.super_Benchmark._vptr_Benchmark != pp_Var1) {
    operator_delete(local_288.super_Benchmark._vptr_Benchmark,
                    (ulong)((long)&(local_288.super_Benchmark.G.super_UndirectedGraph.super_type.
                                    m_edges.
                                    super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                                    ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1));
  }
  if (cVar2._M_node != &local_178) {
    runExample();
  }
  local_190[0] = std::ofstream::ofstream;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_120);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_150);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_180);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    boost::program_options::variables_map args = parseArguments(argc, argv);

    if (args.count("test")) {
        ActionTest actionTest;
        DynamicGraphTest graphTest;
        actionTest.run();
        graphTest.run();
    }
    if (args.count("benchmark")) {
        if (args.count("path")) {
            PathBenchmark pathBenchmark(vertices);
            pathBenchmark.run(deletions, queries);
        }
        if (args.count("tree")) {
            TreeBenchmark treeBenchmark(vertices);
            treeBenchmark.run(deletions, queries);
        }
        if (args.count("random")) {
            RandomGraphBenchmark randomGraphBenchmark(vertices, edges);
            randomGraphBenchmark.run(deletions, queries);
        }
        if (args.count("path-complete")) {
            PathCompleteGraphsBenchmark pathCompleteGraphsBenchmark(
                    static_cast<int>(sqrt(vertices)),
                    static_cast<int>(sqrt(vertices)));
            pathCompleteGraphsBenchmark.run(deletions, queries);
        }
    }
    if (args.count("example")) {
        runExample();
    }

    return 0;
}